

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::MergePartialFromCodedStream
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
           *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 tag;
  uint uVar4;
  ValueOnMemory in_RAX;
  ValueOnMemory *pVVar5;
  ValueOnMemory *pVVar6;
  uint32 first_byte_or_zero;
  string *value;
  ValueOnMemory VVar7;
  ValueOnMemory local_38;
  
  local_38 = in_RAX;
LAB_001bce33:
  do {
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      tag = (uint32)bVar1;
      first_byte_or_zero = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_001bce4e;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_001bce4e:
      tag = io::CodedInputStream::ReadTagFallback(input,first_byte_or_zero);
    }
    if (tag == 10) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      value = (this->key_).ptr_;
      if (value == (string *)&fixed_address_empty_string_abi_cxx11_) {
        ArenaStringPtr::CreateInstance
                  (&this->key_,this->arena_,(string *)&fixed_address_empty_string_abi_cxx11_);
        value = (this->key_).ptr_;
      }
      bVar3 = WireFormatLite::ReadBytes(input,value);
      if (!bVar3) {
        return false;
      }
      uVar4 = this->_has_bits_[0] | 1;
      this->_has_bits_[0] = uVar4;
      pVVar5 = (ValueOnMemory *)input->buffer_;
      pVVar6 = (ValueOnMemory *)input->buffer_end_;
      if ((pVVar5 < pVVar6) && (*(uint8 *)pVVar5 == '\x11')) {
        pVVar5 = (ValueOnMemory *)((long)pVVar5 + 1);
        input->buffer_ = (uint8 *)pVVar5;
LAB_001bcef4:
        uVar4 = uVar4 | 2;
        this->_has_bits_[0] = uVar4;
        if ((int)pVVar6 - (int)pVVar5 < 8) {
          bVar3 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_38);
          if (!bVar3) {
            return false;
          }
          pVVar5 = (ValueOnMemory *)input->buffer_;
          pVVar6 = (ValueOnMemory *)input->buffer_end_;
          uVar4 = this->_has_bits_[0] | 2;
          VVar7 = local_38;
        }
        else {
          VVar7 = *pVVar5;
          pVVar5 = pVVar5 + 1;
          input->buffer_ = (uint8 *)pVVar5;
        }
        this->value_ = VVar7;
        this->_has_bits_[0] = uVar4;
        if ((pVVar5 == pVVar6) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          return true;
        }
      }
      goto LAB_001bce33;
    }
    if (tag == 0x11) {
      uVar4 = this->_has_bits_[0];
      pVVar5 = (ValueOnMemory *)input->buffer_;
      pVVar6 = (ValueOnMemory *)input->buffer_end_;
      goto LAB_001bcef4;
    }
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar3 = WireFormatLite::SkipField(input,tag);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool MergePartialFromCodedStream(::google::protobuf::io::CodedInputStream* input) {
    uint32 tag;

    for (;;) {
      // 1) corrupted data: return false;
      // 2) unknown field: skip without putting into unknown field set;
      // 3) unknown enum value: keep it in parsing. In proto2, caller should
      // check the value and put this entry into containing message's unknown
      // field set if the value is an unknown enum. In proto3, caller doesn't
      // need to care whether the value is unknown enum;
      // 4) missing key/value: missed key/value will have default value. caller
      // should take this entry as if key/value is set to default value.
      tag = input->ReadTagNoLastTag();
      switch (tag) {
        case kKeyTag:
          if (!KeyTypeHandler::Read(input, mutable_key())) {
            return false;
          }
          set_has_key();
          if (!input->ExpectTag(kValueTag)) break;
          GOOGLE_FALLTHROUGH_INTENDED;

        case kValueTag:
          if (!ValueTypeHandler::Read(input, mutable_value())) {
            return false;
          }
          set_has_value();
          if (input->ExpectAtEnd()) return true;
          break;

        default:
          if (tag == 0 ||
              WireFormatLite::GetTagWireType(tag) ==
              WireFormatLite::WIRETYPE_END_GROUP) {
            return true;
          }
          if (!WireFormatLite::SkipField(input, tag)) return false;
          break;
      }
    }
  }